

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePostFS::Run(AdvancedPipelinePostFS *this)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  ulong uVar1;
  bool bVar2;
  GLuint GVar3;
  reference pvVar4;
  float *pfVar5;
  size_type sVar6;
  CallLogWrapper *this_01;
  Vector<float,_4> local_150;
  Vector<float,_4> local_140;
  ulong local_130;
  size_t i_1;
  undefined1 local_120 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_1;
  int i;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_e0;
  char *local_c0;
  char *glsl_cs2;
  string local_b0;
  char *local_90;
  char *glsl_cs;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedPipelinePostFS *this_local;
  
  glsl_fs = 
  "\nconst vec2 g_vertex[4] = vec2[4](vec2(0), vec2(-1, -1), vec2(3, -1), vec2(-1, 3));\nvoid main() {\n  gl_Position = vec4(g_vertex[gl_VertexID], 0, 1);\n}"
  ;
  local_28 = 
  "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(1, 0, 0, 1);\n}";
  glsl_vs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\nconst vec2 g_vertex[4] = vec2[4](vec2(0), vec2(-1, -1), vec2(3, -1), vec2(-1, 3));\nvoid main() {\n  gl_Position = vec4(g_vertex[gl_VertexID], 0, 1);\n}"
             ,&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(1, 0, 0, 1);\n}"
             ,(allocator<char> *)((long)&glsl_cs + 7));
  GVar3 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,&local_48,&local_80);
  this->m_program[0] = GVar3;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&glsl_cs + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program[0]);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program[0],(bool *)0x0);
  if (bVar2) {
    local_90 = 
    "\n#define TILE_WIDTH 16\n#define TILE_HEIGHT 16\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n\n  if (thread_xy == ivec2(0)) {\n    const ivec2 pixel_xy = tile_xy * kTileSize;\n    for (int y = 0; y < TILE_HEIGHT; ++y) {\n      for (int x = 0; x < TILE_WIDTH; ++x) {\n        imageStore(g_output_image, pixel_xy + ivec2(x, y), vec4(0, 1, 0, 1));\n      }\n    }\n  }\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "\n#define TILE_WIDTH 16\n#define TILE_HEIGHT 16\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n\n  if (thread_xy == ivec2(0)) {\n    const ivec2 pixel_xy = tile_xy * kTileSize;\n    for (int y = 0; y < TILE_HEIGHT; ++y) {\n      for (int x = 0; x < TILE_WIDTH; ++x) {\n        imageStore(g_output_image, pixel_xy + ivec2(x, y), vec4(0, 1, 0, 1));\n      }\n    }\n  }\n}"
               ,(allocator<char> *)((long)&glsl_cs2 + 7));
    GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_b0);
    this->m_program[1] = GVar3;
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&glsl_cs2 + 7));
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[1]);
    bVar2 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[1],(bool *)0x0);
    if (bVar2) {
      local_c0 = 
      "\n#define TILE_WIDTH 32\n#define TILE_HEIGHT 32\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvec4 Process(vec4 ic) {\n  return ic + vec4(1, 0, 0, 0);\n}\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;\n  vec4 ic = imageLoad(g_input_image, pixel_xy);\n  imageStore(g_output_image, pixel_xy, Process(ic));\n}"
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "\n#define TILE_WIDTH 32\n#define TILE_HEIGHT 32\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvec4 Process(vec4 ic) {\n  return ic + vec4(1, 0, 0, 0);\n}\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;\n  vec4 ic = imageLoad(g_input_image, pixel_xy);\n  imageStore(g_output_image, pixel_xy, Process(ic));\n}"
                 ,(allocator<char> *)
                  ((long)&data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_e0);
      this->m_program[2] = GVar3;
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[2]);
      bVar2 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program[2],(bool *)0x0);
      if (bVar2) {
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_array);
        this_00 = (allocator<tcu::Vector<float,_4>_> *)
                  ((long)&data_1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,
                   0x4000,this_00);
        std::allocator<tcu::Vector<float,_4>_>::~allocator
                  ((allocator<tcu::Vector<float,_4>_> *)
                   ((long)&data_1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        glu::CallLogWrapper::glGenTextures
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,2,this->m_render_target);
        for (data_1.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            (int)data_1.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage < 2;
            data_1.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)data_1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
          glu::CallLogWrapper::glBindTexture
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0xde1,
                     this->m_render_target
                     [(int)data_1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage]);
          glu::CallLogWrapper::glTexParameteri
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0xde1,0x2801,0x2601);
          pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&i,0);
          pfVar5 = tcu::Vector<float,_4>::operator[](pvVar4,0);
          glu::CallLogWrapper::glTexImage2D
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0xde1,0,0x8814,0x80,0x80,0,0x1908,0x1406,pfVar5);
        }
        glu::CallLogWrapper::glBindTexture
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i);
        this_01 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                   super_CallLogWrapper;
        glu::CallLogWrapper::glGenFramebuffers(this_01,1,&this->m_framebuffer);
        glu::CallLogWrapper::glBindFramebuffer(this_01,0x8d40,this->m_framebuffer);
        glu::CallLogWrapper::glFramebufferTexture(this_01,0x8d40,0x8ce0,this->m_render_target[0],0);
        glu::CallLogWrapper::glBindFramebuffer(this_01,0x8d40,0);
        glu::CallLogWrapper::glBindFramebuffer(this_01,0x8d40,this->m_framebuffer);
        glu::CallLogWrapper::glUseProgram(this_01,this->m_program[0]);
        glu::CallLogWrapper::glBindVertexArray(this_01,this->m_vertex_array);
        glu::CallLogWrapper::glClear(this_01,0x4000);
        glu::CallLogWrapper::glViewport(this_01,0,0,0x80,0x80);
        glu::CallLogWrapper::glDrawArrays(this_01,4,1,3);
        glu::CallLogWrapper::glBindFramebuffer(this_01,0x8d40,0);
        glu::CallLogWrapper::glBindImageTexture
                  (this_01,0,this->m_render_target[0],0,'\0',0,35000,0x8814);
        glu::CallLogWrapper::glBindImageTexture
                  (this_01,1,this->m_render_target[1],0,'\0',0,0x88b9,0x8814);
        glu::CallLogWrapper::glUseProgram(this_01,this->m_program[1]);
        glu::CallLogWrapper::glDispatchCompute(this_01,8,8,1);
        glu::CallLogWrapper::glBindImageTexture
                  (this_01,0,this->m_render_target[1],0,'\0',0,35000,0x8814);
        glu::CallLogWrapper::glBindImageTexture
                  (this_01,1,this->m_render_target[0],0,'\0',0,0x88b9,0x8814);
        glu::CallLogWrapper::glUseProgram(this_01,this->m_program[2]);
        glu::CallLogWrapper::glMemoryBarrier(this_01,0x20);
        glu::CallLogWrapper::glDispatchCompute(this_01,4,4,1);
        std::allocator<tcu::Vector<float,_4>_>::allocator
                  ((allocator<tcu::Vector<float,_4>_> *)((long)&i_1 + 7));
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   local_120,0x4000,(allocator<tcu::Vector<float,_4>_> *)((long)&i_1 + 7));
        std::allocator<tcu::Vector<float,_4>_>::~allocator
                  ((allocator<tcu::Vector<float,_4>_> *)((long)&i_1 + 7));
        glu::CallLogWrapper::glBindTexture
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,this->m_render_target[0]);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x100);
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_120,0);
        pfVar5 = tcu::Vector<float,_4>::operator[](pvVar4,0);
        glu::CallLogWrapper::glGetTexImage
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0,0x1908,0x1406,pfVar5);
        for (local_130 = 0; uVar1 = local_130,
            sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    size((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_120), uVar1 < sVar6; local_130 = local_130 + 1) {
          pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)local_120,local_130);
          tcu::Vector<float,_4>::Vector(&local_140,pvVar4);
          tcu::Vector<float,_4>::Vector(&local_150,1.0,1.0,0.0,1.0);
          bVar2 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_140,&local_150);
          if (!bVar2) {
            anon_unknown_0::Output("Invalid data at index %d.\n",local_130);
            this_local = (AdvancedPipelinePostFS *)&DAT_ffffffffffffffff;
            bVar2 = true;
            goto LAB_00f6ed54;
          }
        }
        bVar2 = false;
LAB_00f6ed54:
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   local_120);
        if (!bVar2) {
          this_local = (AdvancedPipelinePostFS *)0x0;
        }
      }
      else {
        this_local = (AdvancedPipelinePostFS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedPipelinePostFS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedPipelinePostFS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			NL "const vec2 g_vertex[4] = vec2[4](vec2(0), vec2(-1, -1), vec2(3, -1), vec2(-1, 3));" NL
			   "void main() {" NL "  gl_Position = vec4(g_vertex[gl_VertexID], 0, 1);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(1, 0, 0, 1);" NL "}";

		m_program[0] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_cs =
			NL "#define TILE_WIDTH 16" NL "#define TILE_HEIGHT 16" NL
			   "const ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);" NL NL
			   "layout(binding = 0, rgba32f) uniform image2D g_input_image;" NL
			   "layout(binding = 1, rgba32f) uniform image2D g_output_image;" NL	NL
			   "layout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;" NL NL "void main() {" NL
			   "  const ivec2 tile_xy = ivec2(gl_WorkGroupID);" NL
			   "  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL NL "  if (thread_xy == ivec2(0)) {" NL
			   "    const ivec2 pixel_xy = tile_xy * kTileSize;" NL "    for (int y = 0; y < TILE_HEIGHT; ++y) {" NL
			   "      for (int x = 0; x < TILE_WIDTH; ++x) {" NL
			   "        imageStore(g_output_image, pixel_xy + ivec2(x, y), vec4(0, 1, 0, 1));" NL "      }" NL
			   "    }" NL "  }" NL "}";

		m_program[1] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		const char* const glsl_cs2 = NL "#define TILE_WIDTH 32" NL "#define TILE_HEIGHT 32" NL
										"const ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);" NL NL
										"layout(binding = 0, rgba32f) uniform image2D g_input_image;" NL
										"layout(binding = 1, rgba32f) uniform image2D g_output_image;" NL	NL
										"layout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;" NL NL
										"vec4 Process(vec4 ic) {" NL "  return ic + vec4(1, 0, 0, 0);" NL "}" NL
										"void main() {" NL "  const ivec2 tile_xy = ivec2(gl_WorkGroupID);" NL
										"  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
										"  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;" NL
										"  vec4 ic = imageLoad(g_input_image, pixel_xy);" NL
										"  imageStore(g_output_image, pixel_xy, Process(ic));" NL "}";
		m_program[2] = CreateComputeProgram(glsl_cs2);
		glLinkProgram(m_program[2]);
		if (!CheckProgram(m_program[2]))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);

		/* init render targets */
		{
			std::vector<vec4> data(128 * 128);
			glGenTextures(2, m_render_target);
			for (int i = 0; i < 2; ++i)
			{
				glBindTexture(GL_TEXTURE_2D, m_render_target[i]);
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
				glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 128, 128, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			}
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glGenFramebuffers(1, &m_framebuffer);
		glBindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_render_target[0], 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		glBindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
		glUseProgram(m_program[0]);
		glBindVertexArray(m_vertex_array);
		glClear(GL_COLOR_BUFFER_BIT);
		glViewport(0, 0, 128, 128);
		// draw full-viewport triangle
		glDrawArrays(GL_TRIANGLES, 1,
					 3); // note: <first> is 1 this means that gl_VertexID in the VS will be: 1, 2 and 3
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		glBindImageTexture(0, m_render_target[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);  // input
		glBindImageTexture(1, m_render_target[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F); // output
		glUseProgram(m_program[1]);
		glDispatchCompute(128 / 16, 128 / 16, 1);

		glBindImageTexture(0, m_render_target[1], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);  // input
		glBindImageTexture(1, m_render_target[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F); // output
		glUseProgram(m_program[2]);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(128 / 32, 128 / 32, 1);

		/* validate render target */
		{
			std::vector<vec4> data(128 * 128);
			glBindTexture(GL_TEXTURE_2D, m_render_target[0]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(1, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}